

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynModuleImport * ParseImport(ParseContext *ctx)

{
  Lexeme *start_00;
  IntrusiveList<SynIdentifier> path_00;
  IntrusiveList<SynIdentifier> parts;
  bool bVar1;
  SynIdentifier *pSVar2;
  Lexeme *pLVar3;
  ByteCode *bCode;
  SynModuleImport *this;
  Lexeme *pLVar4;
  InplaceStr IVar5;
  char *binary;
  InplaceStr value_1;
  InplaceStr value;
  IntrusiveList<SynIdentifier> path;
  Lexeme *start;
  ParseContext *ctx_local;
  
  start_00 = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_import);
  if (bVar1) {
    IntrusiveList<SynIdentifier>::IntrusiveList((IntrusiveList<SynIdentifier> *)&value.end);
    bVar1 = anon_unknown.dwarf_11716f::CheckAt(ctx,lex_string,"ERROR: name expected after import");
    if (bVar1) {
      IVar5 = ParseContext::Consume(ctx);
      pSVar2 = ParseContext::get<SynIdentifier>(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(pSVar2,pLVar4,pLVar3,IVar5);
      IntrusiveList<SynIdentifier>::push_back((IntrusiveList<SynIdentifier> *)&value.end,pSVar2);
    }
    while (bVar1 = ParseContext::Consume(ctx,lex_point), bVar1) {
      bVar1 = anon_unknown.dwarf_11716f::CheckAt(ctx,lex_string,"ERROR: name expected after \'.\'");
      if (bVar1) {
        IVar5 = ParseContext::Consume(ctx);
        pSVar2 = ParseContext::get<SynIdentifier>(ctx);
        pLVar4 = ParseContext::Previous(ctx);
        pLVar3 = ParseContext::Previous(ctx);
        SynIdentifier::SynIdentifier(pSVar2,pLVar4,pLVar3,IVar5);
        IntrusiveList<SynIdentifier>::push_back((IntrusiveList<SynIdentifier> *)&value.end,pSVar2);
      }
    }
    anon_unknown.dwarf_11716f::CheckConsume
              (ctx,lex_semicolon,"ERROR: \';\' not found after import expression");
    parts.tail = path.head;
    parts.head = (SynIdentifier *)value.end;
    bCode = (ByteCode *)GetBytecodeFromPath(ctx,start_00,parts);
    if (bCode != (ByteCode *)0x0) {
      ImportModuleNamespaces(ctx,start_00,bCode);
      SmallArray<InplaceStr,_8U>::pop_back(&ctx->activeImports);
      this = ParseContext::get<SynModuleImport>(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      path_00.tail = path.head;
      path_00.head = (SynIdentifier *)value.end;
      SynModuleImport::SynModuleImport(this,start_00,pLVar4,path_00,bCode);
      return this;
    }
  }
  return (SynModuleImport *)0x0;
}

Assistant:

SynModuleImport* ParseImport(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_import))
	{
		IntrusiveList<SynIdentifier> path;

		if(CheckAt(ctx, lex_string, "ERROR: name expected after import"))
		{
			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		while(ctx.Consume(lex_point))
		{
			if(CheckAt(ctx, lex_string, "ERROR: name expected after '.'"))
			{
				InplaceStr value = ctx.Consume();
				path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
			}
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after import expression");

		if(const char *binary = GetBytecodeFromPath(ctx, start, path))
		{
			ImportModuleNamespaces(ctx, start, (ByteCode*)binary);

			ctx.activeImports.pop_back();

			return new (ctx.get<SynModuleImport>()) SynModuleImport(start, ctx.Previous(), path, (ByteCode*)binary);
		}
	}

	return NULL;
}